

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

void __thiscall TempFile::~TempFile(TempFile *this)

{
  remove(*(char **)this);
  if (*(TempFile **)this != this + 0x10) {
    operator_delete(*(TempFile **)this,*(long *)(this + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

TempFile::~TempFile() {
  std::remove(name_.c_str());
}